

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O2

string * __thiscall
Download::GetFileExtensionName(string *__return_storage_ptr__,Download *this,string *url)

{
  long lVar1;
  string extensionSeparator;
  allocator local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&extensionSeparator)
  ;
  std::__cxx11::string::string((string *)&extensionSeparator,".",local_30);
  if (url->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::rfind((string *)url,(ulong)&extensionSeparator);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_30,(ulong)url);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
      std::__cxx11::string::~string((string *)local_30);
    }
  }
  std::__cxx11::string::~string((string *)&extensionSeparator);
  return __return_storage_ptr__;
}

Assistant:

std::string Download::GetFileExtensionName(const std::string &url)
{ 
	std::string fileExtensionName="";
	std::string extensionSeparator = ".";
	if(!url.empty())
	{
		size_t index = url.rfind(extensionSeparator);
		if(index != std::string::npos)
		{
			fileExtensionName = url.substr(index+extensionSeparator.length());
		}
	}
	return fileExtensionName;
}